

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi.cpp
# Opt level: O0

void __thiscall Spi::flash_write_enable(Spi *this)

{
  uint8_t local_11;
  Spi *pSStack_10;
  uint8_t data [1];
  Spi *this_local;
  
  pSStack_10 = this;
  if ((this->verbose & 1U) != 0) {
    fprintf(_stdout,"status before enable:\n");
    flash_read_status(this);
  }
  if ((this->verbose & 1U) != 0) {
    fprintf(_stdout,"write enable..\n");
  }
  local_11 = '\x06';
  flash_chip_select(this);
  xfer_spi(this,&local_11,1);
  flash_chip_deselect(this);
  if ((this->verbose & 1U) != 0) {
    fprintf(_stdout,"status after enable:\n");
    flash_read_status(this);
  }
  return;
}

Assistant:

void Spi::flash_write_enable() {
	if (verbose) {
		fprintf(stdout, "status before enable:\n");
		flash_read_status();
	}

	if (verbose)
		fprintf(stdout, "write enable..\n");

	uint8_t data[1] = { FC_WE };
	flash_chip_select();
	xfer_spi(data, 1);
	flash_chip_deselect();

	if (verbose) {
		fprintf(stdout, "status after enable:\n");
		flash_read_status();
	}
}